

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,
                 CompatibleType t,char **param_6)

{
  cmGeneratorTarget *this;
  bool bVar1;
  CompatibleType t_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pbVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  size_t sVar6;
  char *pcVar7;
  ostream *poVar8;
  pointer ppcVar9;
  char *__s;
  bool bVar10;
  pair<bool,_const_char_*> pVar11;
  string reportEntry;
  string report;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  ostringstream e;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  char *local_2a8;
  string local_298;
  long *local_278;
  long local_268 [2];
  CompatibleType local_254;
  cmGeneratorTarget *local_250;
  string local_248;
  _Base_ptr local_228;
  _Base_ptr local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *local_208;
  char *local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  undefined1 local_1e0 [112];
  ios_base local_170 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_254 = t;
  local_200 = defaultValue;
  local_2a8 = cmTarget::GetProperty(tgt->Target,p);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_48,tgt);
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar10 = _Var5._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_220 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_218 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_228 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210 = _Var5._M_current;
  if (local_220 != local_228 &&
      _Var5._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x10b6,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  local_208 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((local_208->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (local_208->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248," * Target \"","");
    std::__cxx11::string::_M_append((char *)&local_248,(ulong)(tgt->Target->Name)._M_dataplus._M_p);
    if (local_210 != local_218) {
      std::__cxx11::string::append((char *)&local_248);
      pcVar7 = "(unset)";
      if (local_2a8 != (char *)0x0) {
        pcVar7 = local_2a8;
      }
      local_1e0._0_8_ = local_1e0 + 0x10;
      sVar6 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,pcVar7,pcVar7 + sVar6);
      std::__cxx11::string::_M_append((char *)&local_248,local_1e0._0_8_);
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_248);
    std::operator+(&local_68,"INTERFACE_",p);
    ppcVar9 = (local_208->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_250 = tgt;
    if (ppcVar9 !=
        (local_208->
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        this = *ppcVar9;
        cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_1f8,this);
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        pbVar4 = local_1f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar7 = cmTarget::GetProperty(this->Target,&local_68);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        local_298._M_string_length = 0;
        local_298.field_2._M_local_buf[0] = '\0';
        if (_Var5._M_current == pbVar4) {
          pcVar7 = local_2a8;
          if (local_220 != local_228) {
            pcVar7 = "";
          }
          if (local_210 == local_218) {
            local_2a8 = pcVar7;
          }
LAB_0038d7aa:
          bVar1 = false;
        }
        else {
          std::__cxx11::string::append((char *)&local_298);
          std::__cxx11::string::_M_append
                    ((char *)&local_298,(ulong)(this->Target->Name)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_298);
          __s = pcVar7;
          if (pcVar7 == (char *)0x0) {
            __s = "(unset)";
          }
          local_1e0._0_8_ = local_1e0 + 0x10;
          sVar6 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,__s,__s + sVar6);
          std::__cxx11::string::_M_append((char *)&local_298,local_1e0._0_8_);
          pbVar3 = local_210;
          pbVar2 = local_218;
          if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
            operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
          }
          std::__cxx11::string::append((char *)&local_298);
          t_00 = local_254;
          if (pbVar3 == pbVar2) {
            if (local_220 == local_228) {
              if (bVar10) {
                pVar11 = consistentProperty<char_const*>(local_2a8,pcVar7,local_254);
                pcVar7 = pVar11.second;
                std::__cxx11::string::_M_append
                          ((char *)&local_248,(ulong)local_298._M_dataplus._M_p);
                compatibilityAgree_abi_cxx11_((string *)local_1e0,t_00,local_2a8 != pcVar7);
                std::__cxx11::string::_M_append((char *)&local_248,local_1e0._0_8_);
                if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
                  operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
                }
                bVar10 = true;
                if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e0,"The INTERFACE_",0xe);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1e0,(p->_M_dataplus)._M_p,p->_M_string_length
                                     );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," property of \"",0xe);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar8,(this->Target->Name)._M_dataplus._M_p,
                                      (this->Target->Name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8,"\" does\nnot agree with the value of ",0x23);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar8,(p->_M_dataplus)._M_p,p->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," already determined\nfor \"",0x19);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar8,(local_250->Target->Name)._M_dataplus._M_p,
                                      (local_250->Target->Name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".\n",3);
                  std::__cxx11::stringbuf::str();
                  cmSystemTools::Error((char *)local_278,(char *)0x0,(char *)0x0,(char *)0x0);
                  goto LAB_0038da1a;
                }
              }
              else {
                local_1e0._0_8_ = local_1e0 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1e0,local_298._M_dataplus._M_p,
                           local_298._M_dataplus._M_p + local_298._M_string_length);
                std::__cxx11::string::append((char *)local_1e0);
                std::__cxx11::string::_M_append((char *)&local_248,local_1e0._0_8_);
                if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
                  operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
                }
                bVar10 = true;
              }
              goto LAB_0038d76b;
            }
            pVar11 = consistentProperty<char_const*>("",pcVar7,local_254);
            std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_298._M_dataplus._M_p);
            compatibilityAgree_abi_cxx11_((string *)local_1e0,t_00,pVar11.second != "");
            std::__cxx11::string::_M_append((char *)&local_248,local_1e0._0_8_);
            if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
              operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
            }
            local_2a8 = pVar11.second;
            if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
            goto LAB_0038d7aa;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Property ",9);
            pcVar7 = local_200;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1e0,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," on target \"",0xc);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(local_250->Target->Name)._M_dataplus._M_p,
                                (local_250->Target->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" is\nimplied to be ",0x13);
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
            }
            else {
              sVar6 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,
                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                       ,0x4c);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," property on\ndependency \"",0x19);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(this->Target->Name)._M_dataplus._M_p,
                                (this->Target->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" is in conflict.\n",0x12);
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error((char *)local_278,(char *)0x0,(char *)0x0,(char *)0x0);
            if (local_278 != local_268) {
              operator_delete(local_278,local_268[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
            std::ios_base::~ios_base(local_170);
            bVar1 = true;
            local_2a8 = "";
          }
          else {
            pVar11 = consistentProperty<char_const*>(local_2a8,pcVar7,local_254);
            pcVar7 = pVar11.second;
            std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_298._M_dataplus._M_p);
            compatibilityAgree_abi_cxx11_((string *)local_1e0,t_00,local_2a8 != pcVar7);
            std::__cxx11::string::_M_append((char *)&local_248,local_1e0._0_8_);
            if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
              operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
            }
            if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Property ",9)
              ;
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1e0,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," on target \"",0xc);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(local_250->Target->Name)._M_dataplus._M_p,
                                  (local_250->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"\" does\nnot match the INTERFACE_",0x1f);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," property requirement\nof dependency \"",0x25);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(this->Target->Name)._M_dataplus._M_p,
                                  (this->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error((char *)local_278,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0038da1a:
              if (local_278 != local_268) {
                operator_delete(local_278,local_268[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
              std::ios_base::~ios_base(local_170);
              bVar1 = true;
            }
            else {
LAB_0038d76b:
              bVar1 = false;
              local_2a8 = pcVar7;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,
                          CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                   local_298.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1f8);
      } while ((!bVar1) &&
              (ppcVar9 = ppcVar9 + 1,
              ppcVar9 !=
              (local_208->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_finish));
    }
    pcVar7 = "(unset)";
    if (local_2a8 != (char *)0x0) {
      pcVar7 = local_2a8;
    }
    local_1e0._0_8_ = local_1e0 + 0x10;
    sVar6 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,pcVar7,pcVar7 + sVar6);
    compatibilityType_abi_cxx11_(&local_298,local_254);
    cmGeneratorTarget::ReportPropertyOrigin(local_250,p,(string *)local_1e0,&local_248,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,
                      CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                               local_298.field_2._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_2a8;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                          const std::string &p,
                                          const std::string& config,
                                          const char *defaultValue,
                                          CompatibleType t,
                                          PropertyType *)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
      std::find(headPropKeys.begin(), headPropKeys.end(),
                p) != headPropKeys.end();

  const bool impliedByUse =
          tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet)
      || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if(deps.empty())
    {
    return propContent;
    }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet)
    {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
    }
  else if (impliedByUse)
    {
    report += "\" property is implied by use.\n";
    }
  else
    {
    report += "\" property not set.\n";
    }

  std::string interfaceProperty = "INTERFACE_" + p;
  for(std::vector<cmGeneratorTarget const*>::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmGeneratorTarget const* theTarget = *li;

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet =
        std::find(propKeys.begin(), propKeys.end(),
                  interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent =
                    getTypedProperty<PropertyType>(theTarget,
                              interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet)
      {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
      }

    if (explicitlySet)
      {
      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" does\nnot match the "
            "INTERFACE_" << p << " property requirement\nof "
            "dependency \"" << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Explicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else if (impliedByUse)
      {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_" << p << " property on\ndependency \""
            << theTarget->GetName() << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Implicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else
      {
      if (ifaceIsSet)
        {
        if (propInitialized)
          {
          std::pair<bool, PropertyType> consistent =
                                    consistentProperty(propContent,
                                                       ifacePropContent, t);
          report += reportEntry;
          report += compatibilityAgree(t, propContent != consistent.second);
          if (!consistent.first)
            {
            std::ostringstream e;
            e << "The INTERFACE_" << p << " property of \""
              << theTarget->GetName() << "\" does\nnot agree with the value "
                "of " << p << " already determined\nfor \""
              << tgt->GetName() << "\".\n";
            cmSystemTools::Error(e.str().c_str());
            break;
            }
          else
            {
            propContent = consistent.second;
            continue;
            }
          }
        else
          {
          report += reportEntry + "(Interface set)\n";
          propContent = ifacePropContent;
          propInitialized = true;
          }
        }
      else
        {
        // Not set. Nothing to agree on.
        continue;
        }
      }
    }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}